

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::
PlainTemplatedDefines<bool,duckdb::TemplatedParquetValueConversion<bool>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  idx_t copy_count;
  
  if (plain_data->len < num_values) {
    PlainTemplatedInternal<bool,duckdb::TemplatedParquetValueConversion<bool>,false,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  switchD_01602a8a::default(result->data + result_offset,plain_data->ptr,num_values);
  plain_data->len = plain_data->len - num_values;
  plain_data->ptr = plain_data->ptr + num_values;
  return;
}

Assistant:

void PlainTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                           Vector &result) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values,
			                                                                   result_offset, result);
		} else {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values,
			                                                                  result_offset, result);
		}
	}